

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cmd.cpp
# Opt level: O2

void FS_MapCmd(FScanner *sc)

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  int nextSkill;
  char nextmap [9];
  
  uVar3 = (uint)dmflags.Value >> 10;
  FScanner::MustGetString(sc);
  strncpy(nextmap,sc->String,8);
  nextmap[8] = '\0';
  nextSkill = -1;
  uVar3 = uVar3 & 4 | 0x22;
  while (bVar2 = FScanner::GetString(sc), bVar2) {
    bVar2 = FScanner::Compare(sc,"-skill");
    if (bVar2) {
      FScanner::MustGetNumber(sc);
      iVar1 = sc->Number + -1;
      nextSkill = AllSkills.Count - 1;
      if (iVar1 < (int)(AllSkills.Count - 1)) {
        nextSkill = iVar1;
      }
      if (sc->Number < 2) {
        nextSkill = 0;
      }
    }
    else {
      bVar2 = FScanner::Compare(sc,"-monsters");
      if (bVar2) {
        FScanner::MustGetNumber(sc);
        if (sc->Number == 0) {
          uVar3 = uVar3 | 4;
        }
        else {
          uVar3 = uVar3 & 0xfffffffb;
        }
      }
      else {
        bVar2 = FScanner::Compare(sc,"-noresetplayers");
        if (bVar2) {
          uVar3 = uVar3 & 0xffffffdd;
        }
      }
    }
  }
  G_ChangeLevel(nextmap,0,uVar3,nextSkill);
  return;
}

Assistant:

void FS_MapCmd(FScanner &sc)
{
	char nextmap[9];
	int NextSkill = -1;
	int flags = CHANGELEVEL_RESETINVENTORY|CHANGELEVEL_RESETHEALTH;
	if (dmflags & DF_NO_MONSTERS)
		flags |= CHANGELEVEL_NOMONSTERS;
	sc.MustGetString();
	strncpy (nextmap, sc.String, 8);
	nextmap[8]=0;

	while (sc.GetString())
	{
		if (sc.Compare("-skill"))
		{
			sc.MustGetNumber();
			NextSkill = clamp<int>(sc.Number-1, 0, AllSkills.Size()-1);
		}
		else if (sc.Compare("-monsters"))
		{
			sc.MustGetNumber();
			if (sc.Number)
				flags &= ~CHANGELEVEL_NOMONSTERS;
			else
				flags |= CHANGELEVEL_NOMONSTERS;
		}
		else if (sc.Compare("-noresetplayers"))
		{
			flags &= ~(CHANGELEVEL_RESETINVENTORY|CHANGELEVEL_RESETHEALTH);
		}
	}
	G_ChangeLevel(nextmap, 0, flags, NextSkill);
}